

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O3

ares_status_t ares_uri_parse_query(ares_uri_t *uri,ares_buf_t *buf)

{
  char cVar1;
  char *pcVar2;
  ares_buf_t *buf_00;
  ares_status_t aVar3;
  ares_bool_t aVar4;
  size_t sVar5;
  size_t *psVar6;
  long lVar7;
  ares_status_t aVar8;
  uchar b_1;
  uchar b;
  char *val;
  char *key;
  ares_buf_t *query;
  uchar local_52;
  uchar local_51;
  char *local_50;
  char *local_48;
  ares_buf_t *local_40;
  undefined1 local_38 [8];
  
  local_40 = (ares_buf_t *)0x0;
  sVar5 = ares_buf_len(buf);
  aVar3 = ARES_SUCCESS;
  if (((sVar5 != 0) && (aVar3 = ares_buf_peek_byte(buf,&local_51), aVar3 == ARES_SUCCESS)) &&
     (aVar3 = ARES_SUCCESS, local_51 == '?')) {
    ares_buf_consume(buf,1);
    ares_buf_tag(buf);
    aVar3 = ARES_SUCCESS;
    sVar5 = ares_buf_consume_until_charset(buf,"#",1,ARES_FALSE);
    if ((sVar5 != 0) &&
       (aVar3 = ares_buf_tag_fetch_constbuf(buf,&local_40), buf_00 = local_40, aVar3 == ARES_SUCCESS
       )) {
      local_48 = (char *)0x0;
      local_50 = (char *)0x0;
      sVar5 = ares_buf_len(local_40);
      while (aVar3 = ARES_SUCCESS, sVar5 != 0) {
        local_52 = '\0';
        ares_buf_tag(buf_00);
        psVar6 = (size_t *)0x0;
        sVar5 = ares_buf_consume_until_charset(buf_00,(uchar *)"&=",2,ARES_FALSE);
        aVar8 = ARES_EBADSTR;
        aVar3 = aVar8;
        if ((((sVar5 == 0) ||
             ((sVar5 = ares_buf_len(buf_00), sVar5 != 0 &&
              (aVar3 = ares_buf_peek_byte(buf_00,&local_52), aVar3 != ARES_SUCCESS)))) ||
            (aVar3 = ares_buf_tag_fetch_strdup(buf_00,&local_48), pcVar2 = local_48,
            aVar3 != ARES_SUCCESS)) || (aVar3 = aVar8, local_48 == (char *)0x0)) break;
        lVar7 = 1;
        do {
          cVar1 = pcVar2[lVar7 + -1];
          if (cVar1 == '\0') break;
          aVar4 = ares_uri_chis_query(cVar1);
          if ((cVar1 != '%') && (aVar4 == ARES_FALSE)) goto LAB_00128adc;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0);
        aVar3 = ares_uri_decode_inplace(pcVar2,ARES_TRUE,(ares_bool_t)local_38,psVar6);
        if (aVar3 != ARES_SUCCESS) break;
        if (local_52 == '=') {
          ares_buf_consume(buf_00,1);
          ares_buf_tag(buf_00);
          psVar6 = (size_t *)0x0;
          sVar5 = ares_buf_consume_until_charset(buf_00,(uchar *)"&",1,ARES_FALSE);
          if (sVar5 != 0) {
            aVar3 = ares_buf_tag_fetch_strdup(buf_00,&local_50);
            pcVar2 = local_50;
            if ((aVar3 != ARES_SUCCESS) || (aVar3 = aVar8, local_50 == (char *)0x0)) break;
            lVar7 = 1;
            do {
              cVar1 = pcVar2[lVar7 + -1];
              if (cVar1 == '\0') break;
              aVar4 = ares_uri_chis_query(cVar1);
              if ((cVar1 != '%') && (aVar4 == ARES_FALSE)) goto LAB_00128adc;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0);
            aVar3 = ares_uri_decode_inplace(pcVar2,ARES_TRUE,(ares_bool_t)local_38,psVar6);
            if (aVar3 != ARES_SUCCESS) break;
          }
        }
        if (local_52 != '\0') {
          ares_buf_consume(buf_00,1);
        }
        aVar3 = ares_uri_set_query_key(uri,local_48,local_50);
        if (aVar3 != ARES_SUCCESS) break;
        ares_free(local_48);
        local_48 = (char *)0x0;
        ares_free(local_50);
        local_50 = (char *)0x0;
        sVar5 = ares_buf_len(buf_00);
      }
LAB_00128adc:
      ares_free(local_48);
      ares_free(local_50);
      ares_buf_destroy(local_40);
    }
  }
  return aVar3;
}

Assistant:

static ares_status_t ares_uri_parse_query(ares_uri_t *uri, ares_buf_t *buf)
{
  unsigned char b;
  ares_status_t status;
  ares_buf_t   *query = NULL;
  size_t        len;

  if (ares_buf_len(buf) == 0) {
    return ARES_SUCCESS;
  }

  status = ares_buf_peek_byte(buf, &b);
  if (status != ARES_SUCCESS) {
    return status;
  }

  /* Not a query, must be one of the others */
  if (b != '?') {
    return ARES_SUCCESS;
  }

  /* Only possible terminator is fragment indicator of '#' */
  ares_buf_consume(buf, 1);
  ares_buf_tag(buf);
  len = ares_buf_consume_until_charset(buf, (const unsigned char *)"#", 1,
                                       ARES_FALSE);
  if (len == 0) {
    /* No data, return */
    return ARES_SUCCESS;
  }

  status = ares_buf_tag_fetch_constbuf(buf, &query);
  if (status != ARES_SUCCESS) {
    return status;
  }

  status = ares_uri_parse_query_buf(uri, query);
  ares_buf_destroy(query);

  return status;
}